

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_XO.cpp
# Opt level: O1

void example::learning_XO(void)

{
  longdouble **pplVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  longdouble lVar6;
  undefined1 acceptableError [16];
  undefined1 learningRate [16];
  undefined1 adaptiveLearningRate [16];
  ostream *poVar7;
  Convolution2D *pCVar8;
  FullyConnected *this;
  Loss *this_00;
  tensor ppplVar9;
  int x;
  uint uVar10;
  longdouble **pplVar11;
  char *__to;
  int iVar12;
  int iVar13;
  int y;
  int iVar14;
  long lVar15;
  Layer *layer;
  int iVar16;
  uint uVar17;
  long lVar18;
  int y_1;
  tensor in [2];
  tensor out [2];
  SequentialModule module;
  undefined2 in_stack_ffffffffffffff22;
  undefined4 in_stack_ffffffffffffff24;
  undefined6 in_stack_ffffffffffffff32;
  char local_b9;
  tensor local_b8;
  tensor local_b0;
  tensor local_a8;
  tensor local_a0;
  SequentialModule local_98;
  
  local_b8 = type::createTensor(8,8,1);
  local_b0 = type::createTensor(8,8,1);
  local_a8 = type::createTensor(2,1,1);
  local_a0 = type::createTensor(2,1,1);
  pplVar1 = *local_b8;
  pplVar11 = pplVar1 + 7;
  lVar15 = 0;
  lVar6 = (longdouble)1;
  do {
    *(longdouble *)(*(long *)((long)pplVar1 + lVar15) + lVar15 * 2) = lVar6;
    *(longdouble *)((long)*pplVar11 + lVar15 * 2) = lVar6;
    pplVar11 = pplVar11 + -1;
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x40);
  plVar2 = **local_a8;
  *plVar2 = lVar6;
  plVar2[1] = (longdouble)0;
  pplVar11 = *local_b0;
  uVar10 = 0;
  iVar14 = 3;
  iVar16 = 2;
  do {
    lVar15 = (long)(int)uVar10 + 4;
    plVar2 = pplVar11[(long)(int)uVar10 + 4];
    lVar18 = (long)iVar14 + 4;
    plVar2[lVar18] = lVar6;
    plVar3 = pplVar11[(long)iVar14 + 4];
    plVar3[lVar15] = lVar6;
    iVar13 = 4 - uVar10;
    plVar4 = pplVar11[iVar13];
    plVar4[lVar18] = lVar6;
    iVar12 = 4 - iVar14;
    plVar5 = pplVar11[iVar12];
    plVar5[lVar15] = lVar6;
    plVar2[iVar12] = lVar6;
    plVar3[iVar13] = lVar6;
    plVar4[iVar12] = lVar6;
    plVar5[iVar13] = lVar6;
    if (SBORROW4(iVar16,uVar10 * 2) == (int)(iVar16 + uVar10 * -2) < 0) {
      uVar17 = ~(uVar10 * 2);
LAB_00104dd6:
      uVar10 = uVar10 + 1;
    }
    else {
      if (iVar14 * -2 + 6 <= iVar16) {
        uVar17 = (~uVar10 + iVar14) * 2;
        iVar14 = iVar14 + -1;
        goto LAB_00104dd6;
      }
      uVar17 = iVar14 * 2 - 1;
      iVar14 = iVar14 + -1;
    }
    iVar16 = iVar16 + uVar17;
    if (iVar14 < (int)uVar10) {
      plVar2 = **local_a0;
      *plVar2 = (longdouble)0;
      plVar2[1] = lVar6;
      lVar15 = 0;
      do {
        lVar18 = 0;
        do {
          poVar7 = std::ostream::_M_insert<long_double>
                             (*(longdouble *)((long)(*local_b8)[lVar15] + lVar18));
          local_98._vptr_SequentialModule._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_98,1);
          lVar18 = lVar18 + 0x10;
        } while (lVar18 != 0x80);
        local_98._vptr_SequentialModule._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_98,1);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
      local_98._vptr_SequentialModule._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      local_98._vptr_SequentialModule._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
      lVar15 = 0;
      do {
        lVar18 = 0;
        do {
          poVar7 = std::ostream::_M_insert<long_double>
                             (*(longdouble *)((long)(*local_b0)[lVar15] + lVar18));
          local_98._vptr_SequentialModule._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_98,1);
          lVar18 = lVar18 + 0x10;
        } while (lVar18 != 0x80);
        local_98._vptr_SequentialModule._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_98,1);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
      ::module::SequentialModule::SequentialModule(&local_98);
      acceptableError._10_2_ = in_stack_ffffffffffffff22;
      acceptableError._0_10_ = (longdouble)0.001;
      acceptableError._12_4_ = in_stack_ffffffffffffff24;
      ::module::SequentialModule::setStopParameter(&local_98,500,(scalar)acceptableError);
      learningRate._10_2_ = in_stack_ffffffffffffff22;
      learningRate._0_10_ = (longdouble)0.2;
      learningRate._12_4_ = in_stack_ffffffffffffff24;
      adaptiveLearningRate._10_6_ = in_stack_ffffffffffffff32;
      adaptiveLearningRate._0_10_ = (longdouble)1e-10;
      ::module::SequentialModule::setTrainingParameter
                (&local_98,(scalar)learningRate,(scalar)adaptiveLearningRate);
      ::module::SequentialModule::setInput(&local_98,8,8,1);
      pCVar8 = (Convolution2D *)operator_new(0x88);
      ::layer::Convolution2D::Convolution2D(pCVar8,2,3,3,2,0,0,1,1);
      ::module::SequentialModule::add(&local_98,(Layer *)pCVar8);
      pCVar8 = (Convolution2D *)operator_new(0x88);
      ::layer::Convolution2D::Convolution2D(pCVar8,2,3,3,2,0,0,1,1);
      ::module::SequentialModule::add(&local_98,(Layer *)pCVar8);
      this = (FullyConnected *)operator_new(0x78);
      ::layer::FullyConnected::FullyConnected(this,8,2,true);
      ::module::SequentialModule::add(&local_98,(Layer *)this);
      this_00 = (Loss *)operator_new(0x88);
      ::layer::Loss::Loss(this_00,2,2,2,true);
      layer = (Layer *)((long)&this_00->_vptr_Loss + (long)this_00->_vptr_Loss[-3]);
      ::module::SequentialModule::add(&local_98,layer);
      ::module::SequentialModule::link(&local_98,(char *)layer,__to);
      local_b9 = 'a';
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_b9,1)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      ::module::SequentialModule::training(&local_98,&local_b8,&local_a8,2,1.0);
      local_b9 = 'b';
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_b9,1)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Resulta: ",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      ::module::SequentialModule::predict(&local_98,local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  X : ",6);
      ppplVar9 = ::layer::Layer::getPtrOut
                           (local_98._lLayers.
                            super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
      poVar7 = std::ostream::_M_insert<long_double>(***ppplVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      ppplVar9 = ::layer::Layer::getPtrOut
                           (local_98._lLayers.
                            super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
      poVar7 = std::ostream::_M_insert<long_double>((**ppplVar9)[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      ::module::SequentialModule::predict(&local_98,local_b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  O : ",6);
      ppplVar9 = ::layer::Layer::getPtrOut
                           (local_98._lLayers.
                            super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
      poVar7 = std::ostream::_M_insert<long_double>(***ppplVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      ppplVar9 = ::layer::Layer::getPtrOut
                           (local_98._lLayers.
                            super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
      poVar7 = std::ostream::_M_insert<long_double>((**ppplVar9)[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      ::module::SequentialModule::~SequentialModule(&local_98);
      return;
    }
  } while( true );
}

Assistant:

void learning_XO()
    {
        type::tensor in[2];
        in[0] = type::createTensor(8, 8, 1);
        in[1] = type::createTensor(8, 8, 1);

        type::tensor out[2];
        out[0] = type::createTensor(2, 1, 1);
        out[1] = type::createTensor(2, 1, 1);

        for(int i(0); i < 8; i++){
            (*in[0])[i][i] = 1;
            (*in[0])[7 - i][i] = 1;
        }
        (**out[0])[0] = 1;
        (**out[0])[1] = 0;

        {
            int x = 0;
            int y = 3;
            int d = 3 - 1;
            while (y >= x)
            {
                (*in[1])[4 + x][4 + y] = 1;
                (*in[1])[4 + y][4 + x] = 1;
                (*in[1])[4 - x][4 + y] = 1;
                (*in[1])[4 - y][4 + x] = 1;
                (*in[1])[4 + x][4 - y] = 1;
                (*in[1])[4 + y][4 - x] = 1;
                (*in[1])[4 - x][4 - y] = 1;
                (*in[1])[4 - y][4 - x] = 1;

                if (d >= 2 * x)
                {
                    d -= 2 * x + 1;
                    x++;
                }
                else if (d < 2 * (3 - y))
                {
                    d += 2 * y - 1;
                    y--;
                }
                else
                {
                    d += 2 * (y - x - 1);
                    y--;
                    x++;
                }
            }
        }
        (**out[1])[0] = 0;
        (**out[1])[1] = 1;

        for(int y(0); y < 8; y++) {
            for(int x(0); x < 8; x++) {
                std::cout << (*in[0])[y][x] << ' ';
            }
            std::cout << '\n';
        }
        std::cout << '\n';
        std::cout << '\n';

        for(int y(0); y < 8; y++) {
            for(int x(0); x < 8; x++) {
                std::cout << (*in[1])[y][x] << ' ';
            }
            std::cout << '\n';
        }

        function::tool::initParamRandTool(-0.1, 0.1);
        function::tool::initRandTool(486446);
        module::SequentialModule module;
        module.setStopParameter(500, 0.001);
        module.setTrainingParameter(0.2, 0.0000000001);
        module.setInput(8, 8, 1);
        module.add(new layer::Convolution2D(2, 3, 3, ACTIVATION_SIGMOIDE, 0, 0, 1, 1));
        module.add(new layer::Convolution2D(2, 3, 3, ACTIVATION_SIGMOIDE, 0, 0, 1, 1));
        module.add(new layer::FullyConnected(8, ACTIVATION_SIGMOIDE, true));
        module.add(new layer::Loss(2, ACTIVATION_SIGMOIDE, LOSS_LOGLOSS, true));
        module.link();

        std::cout << 'a' << std::endl;
        module.training(in, out, 2, 1);
        std::cout << 'b' << std::endl;

        std::cout << "- Resulta: " << std::endl;
        module.predict(in[0]);
        std::cout << "  X : " << (**module.getOut())[0] << ", " << (**module.getOut())[1] << std::endl;
        module.predict(in[1]);
        std::cout << "  O : " << (**module.getOut())[0] << ", " << (**module.getOut())[1] << std::endl;



    }